

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,XMLException *except,Locator *aLocator)

{
  XMLErrorReporter *pXVar1;
  Codes CVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ErrTypes errType;
  uint toEmit;
  XMLCh *errText;
  Locator *aLocator_local;
  XMLException *except_local;
  XSDErrorReporter *this_local;
  
  pXVar7 = XMLException::getMessage(except);
  CVar2 = XMLException::getCode(except);
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    pXVar1 = this->fErrorReporter;
    iVar3 = (*aLocator->_vptr_Locator[3])();
    iVar4 = (*aLocator->_vptr_Locator[2])();
    iVar5 = (*aLocator->_vptr_Locator[4])();
    iVar6 = (*aLocator->_vptr_Locator[5])();
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,(ulong)CVar2,XMLUni::fgExceptDomain,1,pXVar7,CONCAT44(extraout_var,iVar3),
               CONCAT44(extraout_var_00,iVar4),CONCAT44(extraout_var_01,iVar5),
               CONCAT44(extraout_var_02,iVar6));
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const XMLException&  except,
                                 const Locator* const aLocator)
{
    const XMLCh* const  errText = except.getMessage();
    const unsigned int  toEmit = except.getCode();
    //Before the code was modified to call this routine it used to use
    //the XMLErrs::DisplayErrorMessage error message, which is just {'0'}
    //and that error message has errType of Error.  So to be consistent
    //with previous behaviour set the errType to be Error instead of
    //getting the error type off of the exception.
    //XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);
    XMLErrorReporter::ErrTypes errType = XMLErrorReporter::ErrType_Error;

    if (fErrorReporter)
        fErrorReporter->error(toEmit, XMLUni::fgExceptDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    //if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
    //    throw (XMLErrs::Codes) toEmit;
}